

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EnsureFncDeclScopeSlot
          (ByteCodeGenerator *this,ParseNodeFnc *pnodeFnc,FuncInfo *funcInfo)

{
  Symbol *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (pnodeFnc->pnodeName != (ParseNodeVar *)0x0) {
    if ((pnodeFnc->pnodeName->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xd9a,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                         "pnodeFnc->pnodeName->nop == knopVarDecl");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    this_00 = pnodeFnc->pnodeName->sym;
    if (this_00 != (Symbol *)0x0) {
      bVar2 = Symbol::IsArguments(this_00);
      if (!bVar2) {
        Symbol::EnsureScopeSlot(this_00,this,funcInfo);
        return;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::EnsureFncDeclScopeSlot(ParseNodeFnc *pnodeFnc, FuncInfo *funcInfo)
{
    if (pnodeFnc->pnodeName)
    {
        Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
        Symbol *sym = pnodeFnc->pnodeName->sym;
        // If this function is shadowing the arguments symbol in body then skip it.
        // We will allocate scope slot for the arguments symbol during EmitLocalPropInit.
        if (sym && !sym->IsArguments())
        {
            sym->EnsureScopeSlot(this, funcInfo);
        }
    }
}